

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_emit.cpp
# Opt level: O2

void __thiscall pstore::exchange::export_ns::emit_digest(export_ns *this,ostream_base *os,uint128 d)

{
  char *pcVar1;
  char *__n;
  void *__buf;
  void *__buf_00;
  span<char,_32L> local_50;
  uint128 d_local;
  array<char,_32UL> hex;
  
  d_local.v_._0_8_ = os;
  pcVar1 = uint128::to_hex<char*>(&d_local,hex._M_elems);
  __n = &stack0xffffffffffffffe8;
  if (pcVar1 == __n) {
    ostream_base::write((ostream_base *)this,0x22,__buf,(size_t)__n);
    local_50.storage_.data_ =
         (storage_type<pstore::gsl::details::extent_type<32L>_>)
         (storage_type<pstore::gsl::details::extent_type<32L>_>)&hex;
    details::write_span<char,32l>((ostream_base *)this,&local_50);
    ostream_base::write((ostream_base *)this,0x22,__buf_00,(size_t)__n);
    return;
  }
  assert_failed("out == hex.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_emit.cpp"
                ,0x21);
}

Assistant:

void emit_digest (ostream_base & os, uint128 const d) {
                std::array<char, uint128::hex_string_length> hex;
                decltype (hex)::const_iterator const out = d.to_hex (hex.begin ());
                (void) out;
                PSTORE_ASSERT (out == hex.end ());
                os << '"';
                details::write_span (os, gsl::make_span (hex));
                os << '"';
            }